

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O3

void FastPForLib::fastpack(uint64_t *in,uint32_t *out,uint32_t bit)

{
  switch(bit) {
  case 0:
    __fastpack0(in,out);
    return;
  case 1:
    __fastpack1(in,out);
    return;
  case 2:
    __fastpack2(in,out);
    return;
  case 3:
    __fastpack3(in,out);
    return;
  case 4:
    __fastpack4(in,out);
    return;
  case 5:
    __fastpack5(in,out);
    return;
  case 6:
    __fastpack6(in,out);
    return;
  case 7:
    __fastpack7(in,out);
    return;
  case 8:
    __fastpack8(in,out);
    return;
  case 9:
    __fastpack9(in,out);
    return;
  case 10:
    __fastpack10(in,out);
    return;
  case 0xb:
    __fastpack11(in,out);
    return;
  case 0xc:
    __fastpack12(in,out);
    return;
  case 0xd:
    __fastpack13(in,out);
    return;
  case 0xe:
    __fastpack14(in,out);
    return;
  case 0xf:
    __fastpack15(in,out);
    return;
  case 0x10:
    __fastpack16(in,out);
    return;
  case 0x11:
    __fastpack17(in,out);
    return;
  case 0x12:
    __fastpack18(in,out);
    return;
  case 0x13:
    __fastpack19(in,out);
    return;
  case 0x14:
    __fastpack20(in,out);
    return;
  case 0x15:
    __fastpack21(in,out);
    return;
  case 0x16:
    __fastpack22(in,out);
    return;
  case 0x17:
    __fastpack23(in,out);
    return;
  case 0x18:
    __fastpack24(in,out);
    return;
  case 0x19:
    __fastpack25(in,out);
    return;
  case 0x1a:
    __fastpack26(in,out);
    return;
  case 0x1b:
    __fastpack27(in,out);
    return;
  case 0x1c:
    __fastpack28(in,out);
    return;
  case 0x1d:
    __fastpack29(in,out);
    return;
  case 0x1e:
    __fastpack30(in,out);
    return;
  case 0x1f:
    __fastpack31(in,out);
    return;
  case 0x20:
    __fastpack32(in,out);
    return;
  case 0x21:
    __fastpack33(in,out);
    return;
  case 0x22:
    __fastpack34(in,out);
    return;
  case 0x23:
    __fastpack35(in,out);
    return;
  case 0x24:
    __fastpack36(in,out);
    return;
  case 0x25:
    __fastpack37(in,out);
    return;
  case 0x26:
    __fastpack38(in,out);
    return;
  case 0x27:
    __fastpack39(in,out);
    return;
  case 0x28:
    __fastpack40(in,out);
    return;
  case 0x29:
    __fastpack41(in,out);
    return;
  case 0x2a:
    __fastpack42(in,out);
    return;
  case 0x2b:
    __fastpack43(in,out);
    return;
  case 0x2c:
    __fastpack44(in,out);
    return;
  case 0x2d:
    __fastpack45(in,out);
    return;
  case 0x2e:
    __fastpack46(in,out);
    return;
  case 0x2f:
    __fastpack47(in,out);
    return;
  case 0x30:
    __fastpack48(in,out);
    return;
  case 0x31:
    __fastpack49(in,out);
    return;
  case 0x32:
    __fastpack50(in,out);
    return;
  case 0x33:
    __fastpack51(in,out);
    return;
  case 0x34:
    __fastpack52(in,out);
    return;
  case 0x35:
    __fastpack53(in,out);
    return;
  case 0x36:
    __fastpack54(in,out);
    return;
  case 0x37:
    __fastpack55(in,out);
    return;
  case 0x38:
    __fastpack56(in,out);
    return;
  case 0x39:
    __fastpack57(in,out);
    return;
  case 0x3a:
    __fastpack58(in,out);
    return;
  case 0x3b:
    __fastpack59(in,out);
    return;
  case 0x3c:
    __fastpack60(in,out);
    return;
  case 0x3d:
    __fastpack61(in,out);
    return;
  case 0x3e:
    __fastpack62(in,out);
    return;
  case 0x3f:
    __fastpack63(in,out);
    return;
  case 0x40:
    __fastpack64(in,out);
    return;
  default:
    return;
  }
}

Assistant:

inline void fastpack(const uint64_t *__restrict__ in,
                     uint32_t *__restrict__ out, const uint32_t bit) {
  switch (bit) {
  case 0:
    __fastpack0(in, out);
    break;
  case 1:
    __fastpack1(in, out);
    break;
  case 2:
    __fastpack2(in, out);
    break;
  case 3:
    __fastpack3(in, out);
    break;
  case 4:
    __fastpack4(in, out);
    break;
  case 5:
    __fastpack5(in, out);
    break;
  case 6:
    __fastpack6(in, out);
    break;
  case 7:
    __fastpack7(in, out);
    break;
  case 8:
    __fastpack8(in, out);
    break;
  case 9:
    __fastpack9(in, out);
    break;
  case 10:
    __fastpack10(in, out);
    break;
  case 11:
    __fastpack11(in, out);
    break;
  case 12:
    __fastpack12(in, out);
    break;
  case 13:
    __fastpack13(in, out);
    break;
  case 14:
    __fastpack14(in, out);
    break;
  case 15:
    __fastpack15(in, out);
    break;
  case 16:
    __fastpack16(in, out);
    break;
  case 17:
    __fastpack17(in, out);
    break;
  case 18:
    __fastpack18(in, out);
    break;
  case 19:
    __fastpack19(in, out);
    break;
  case 20:
    __fastpack20(in, out);
    break;
  case 21:
    __fastpack21(in, out);
    break;
  case 22:
    __fastpack22(in, out);
    break;
  case 23:
    __fastpack23(in, out);
    break;
  case 24:
    __fastpack24(in, out);
    break;
  case 25:
    __fastpack25(in, out);
    break;
  case 26:
    __fastpack26(in, out);
    break;
  case 27:
    __fastpack27(in, out);
    break;
  case 28:
    __fastpack28(in, out);
    break;
  case 29:
    __fastpack29(in, out);
    break;
  case 30:
    __fastpack30(in, out);
    break;
  case 31:
    __fastpack31(in, out);
    break;
  case 32:
    __fastpack32(in, out);
    break;
  case 33:
    __fastpack33(in, out);
    break;
  case 34:
    __fastpack34(in, out);
    break;
  case 35:
    __fastpack35(in, out);
    break;
  case 36:
    __fastpack36(in, out);
    break;
  case 37:
    __fastpack37(in, out);
    break;
  case 38:
    __fastpack38(in, out);
    break;
  case 39:
    __fastpack39(in, out);
    break;
  case 40:
    __fastpack40(in, out);
    break;
  case 41:
    __fastpack41(in, out);
    break;
  case 42:
    __fastpack42(in, out);
    break;
  case 43:
    __fastpack43(in, out);
    break;
  case 44:
    __fastpack44(in, out);
    break;
  case 45:
    __fastpack45(in, out);
    break;
  case 46:
    __fastpack46(in, out);
    break;
  case 47:
    __fastpack47(in, out);
    break;
  case 48:
    __fastpack48(in, out);
    break;
  case 49:
    __fastpack49(in, out);
    break;
  case 50:
    __fastpack50(in, out);
    break;
  case 51:
    __fastpack51(in, out);
    break;
  case 52:
    __fastpack52(in, out);
    break;
  case 53:
    __fastpack53(in, out);
    break;
  case 54:
    __fastpack54(in, out);
    break;
  case 55:
    __fastpack55(in, out);
    break;
  case 56:
    __fastpack56(in, out);
    break;
  case 57:
    __fastpack57(in, out);
    break;
  case 58:
    __fastpack58(in, out);
    break;
  case 59:
    __fastpack59(in, out);
    break;
  case 60:
    __fastpack60(in, out);
    break;
  case 61:
    __fastpack61(in, out);
    break;
  case 62:
    __fastpack62(in, out);
    break;
  case 63:
    __fastpack63(in, out);
    break;
  case 64:
    __fastpack64(in, out);
    break;
  default:
    break;
  }
}